

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall QList<QtCbor::Element>::detach(QList<QtCbor::Element> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    return;
  }
  QArrayDataPointer<QtCbor::Element>::reallocateAndGrow
            (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QtCbor::Element> *)0x0);
  return;
}

Assistant:

bool needsDetach() const noexcept { return !d || d->needsDetach(); }